

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O3

Vector<double,_4> * __thiscall
tcu::faceForward<double,4>
          (Vector<double,_4> *__return_storage_ptr__,tcu *this,Vector<double,_4> *n,
          Vector<double,_4> *i,Vector<double,_4> *ref)

{
  tcu *ptVar1;
  double *pdVar2;
  double dVar3;
  undefined8 uVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  Vector<double,_4> *res_1;
  long lVar8;
  double res;
  
  res_1 = __return_storage_ptr__;
  dVar3 = 0.0;
  lVar8 = 0;
  do {
    dVar3 = dVar3 + i->m_data[lVar8] * n->m_data[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  if (dVar3 < 0.0) {
    dVar3 = *(double *)this;
    dVar6 = *(double *)(this + 8);
    dVar7 = *(double *)(this + 0x18);
    __return_storage_ptr__->m_data[2] = *(double *)(this + 0x10);
    __return_storage_ptr__->m_data[3] = dVar7;
    __return_storage_ptr__->m_data[0] = dVar3;
    __return_storage_ptr__->m_data[1] = dVar6;
    return res_1;
  }
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  lVar8 = 0;
  do {
    ptVar1 = this + lVar8 * 8;
    uVar5 = *(uint *)(ptVar1 + 4);
    uVar4 = *(undefined8 *)(ptVar1 + 8);
    pdVar2 = __return_storage_ptr__->m_data + lVar8;
    *(undefined4 *)pdVar2 = *(undefined4 *)ptVar1;
    *(uint *)((long)pdVar2 + 4) = uVar5 ^ 0x80000000;
    *(int *)(pdVar2 + 1) = (int)uVar4;
    *(uint *)((long)pdVar2 + 0xc) = (uint)((ulong)uVar4 >> 0x20) ^ 0x80000000;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 4);
  return res_1;
}

Assistant:

inline Vector<T, Size> faceForward (const Vector<T, Size>& n, const Vector<T, Size>& i, const Vector<T, Size>& ref)
{
	return (dot(ref, i) < T(0)) ? n: -n;
}